

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_compute_table_impl.h
# Opt level: O0

void secp256k1_ecmult_compute_two_tables
               (secp256k1_ge_storage *table,secp256k1_ge_storage *table_128,int window_g,
               secp256k1_ge *gen)

{
  int i;
  secp256k1_gej gj;
  undefined4 in_stack_000000b0;
  secp256k1_gej *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int iVar1;
  
  secp256k1_gej_set_ge
            ((secp256k1_gej *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (secp256k1_ge *)in_stack_ffffffffffffff38);
  secp256k1_ecmult_compute_table
            ((secp256k1_ge_storage *)CONCAT44(window_g,in_stack_000000b0),gen._4_4_,
             (secp256k1_gej *)gj._144_8_);
  for (iVar1 = 0; iVar1 < 0x80; iVar1 = iVar1 + 1) {
    secp256k1_gej_double_var
              ((secp256k1_gej *)CONCAT44(iVar1,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38,
               (secp256k1_fe *)0x10b854);
  }
  secp256k1_ecmult_compute_table
            ((secp256k1_ge_storage *)CONCAT44(window_g,in_stack_000000b0),gen._4_4_,
             (secp256k1_gej *)gj._144_8_);
  return;
}

Assistant:

static void secp256k1_ecmult_compute_two_tables(secp256k1_ge_storage* table, secp256k1_ge_storage* table_128, int window_g, const secp256k1_ge* gen) {
    secp256k1_gej gj;
    int i;

    secp256k1_gej_set_ge(&gj, gen);
    secp256k1_ecmult_compute_table(table, window_g, &gj);
    for (i = 0; i < 128; ++i) {
        secp256k1_gej_double_var(&gj, &gj, NULL);
    }
    secp256k1_ecmult_compute_table(table_128, window_g, &gj);
}